

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuinfo.cpp
# Opt level: O1

void __thiscall asmjit::CpuInfo::detect(CpuInfo *this)

{
  CpuFeatures *pCVar1;
  byte *pbVar2;
  BitWord *pBVar3;
  undefined1 auVar4 [64];
  char cVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  anon_union_16_2_66d2be9b_for_CpuInfo_9 aVar9;
  undefined1 auVar10 [16];
  uint32_t uVar11;
  ulong uVar12;
  char cVar13;
  uint32_t dw2;
  uint uVar14;
  uint32_t dw1;
  uint uVar15;
  uint uVar16;
  char *d;
  char *pcVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  char *pcVar21;
  uint in_XCR0;
  
  auVar4 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  *(undefined1 (*) [64])(this->_brandString + 8) = auVar4;
  auVar4 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  this->_archInfo = (ArchInfo)auVar4._0_4_;
  this->_vendorId = auVar4._4_4_;
  this->_family = auVar4._8_4_;
  this->_model = auVar4._12_4_;
  this->_stepping = auVar4._16_4_;
  this->_hwThreadsCount = auVar4._20_4_;
  this->_features = (CpuFeatures)auVar4._24_16_;
  this->_vendorString[0] = auVar4[0x28];
  this->_vendorString[1] = auVar4[0x29];
  this->_vendorString[2] = auVar4[0x2a];
  this->_vendorString[3] = auVar4[0x2b];
  this->_vendorString[4] = auVar4[0x2c];
  this->_vendorString[5] = auVar4[0x2d];
  this->_vendorString[6] = auVar4[0x2e];
  this->_vendorString[7] = auVar4[0x2f];
  this->_vendorString[8] = auVar4[0x30];
  this->_vendorString[9] = auVar4[0x31];
  this->_vendorString[10] = auVar4[0x32];
  this->_vendorString[0xb] = auVar4[0x33];
  this->_vendorString[0xc] = auVar4[0x34];
  this->_vendorString[0xd] = auVar4[0x35];
  this->_vendorString[0xe] = auVar4[0x36];
  this->_vendorString[0xf] = auVar4[0x37];
  this->_brandString[0] = auVar4[0x38];
  this->_brandString[1] = auVar4[0x39];
  this->_brandString[2] = auVar4[0x3a];
  this->_brandString[3] = auVar4[0x3b];
  this->_brandString[4] = auVar4[0x3c];
  this->_brandString[5] = auVar4[0x3d];
  this->_brandString[6] = auVar4[0x3e];
  this->_brandString[7] = auVar4[0x3f];
  *(undefined8 *)((long)&this->field_9 + 8) = 0;
  lVar20 = 0;
  ArchInfo::init(&this->_archInfo,(EVP_PKEY_CTX *)0x2);
  *(byte *)(this->_features)._bits = (byte)(this->_features)._bits[0] | 2;
  puVar6 = (uint *)cpuid_basic_info(0);
  uVar19 = *puVar6;
  uVar15 = puVar6[1];
  uVar18 = puVar6[2];
  uVar7 = puVar6[3];
  pCVar1 = &this->_features;
  *(uint *)this->_vendorString = uVar15;
  *(uint *)(this->_vendorString + 4) = uVar18;
  *(uint *)(this->_vendorString + 8) = uVar7;
  do {
    if (((uVar15 == *(uint *)(x86GetCpuVendorID(char_const*)::vendorList + lVar20 + 4)) &&
        (uVar18 == *(uint *)(x86GetCpuVendorID(char_const*)::vendorList + lVar20 + 8))) &&
       (uVar7 == *(uint *)(x86GetCpuVendorID(char_const*)::vendorList + lVar20 + 0xc))) {
      uVar11 = *(uint32_t *)(x86GetCpuVendorID(char_const*)::vendorList + lVar20);
      goto LAB_00165215;
    }
    lVar20 = lVar20 + 0x10;
  } while (lVar20 != 0x40);
  uVar11 = 0;
LAB_00165215:
  this->_vendorId = uVar11;
  if (uVar19 == 0) {
    uVar15 = 0;
  }
  else {
    puVar6 = (uint *)cpuid_Version_info(1);
    uVar15 = *puVar6;
    uVar18 = puVar6[1];
    uVar7 = puVar6[2];
    uVar8 = puVar6[3];
    uVar16 = uVar15 >> 8 & 0xf;
    this->_family = uVar16;
    uVar14 = uVar15 >> 4 & 0xf;
    this->_model = uVar14;
    this->_stepping = uVar15 & 0xf;
    if (uVar16 == 0xf) {
      this->_family = (uVar15 >> 0x14 & 0xff) + 0xf;
      this->_model = uVar14 | uVar15 >> 0xc & 0xf0;
    }
    auVar10 = vpinsrd_avx(ZEXT416(uVar15 >> 0xc),uVar18,1);
    auVar10 = vpinsrd_avx(auVar10,uVar18 >> 5,2);
    auVar10 = vpinsrd_avx(auVar10,uVar18 >> 0x10,3);
    aVar9 = (anon_union_16_2_66d2be9b_for_CpuInfo_9)vpand_avx(auVar10,_DAT_00178f30);
    this->field_9 = aVar9;
    if ((uVar8 & 1) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 3);
      *pbVar2 = *pbVar2 | 0x10;
    }
    if ((uVar8 & 2) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 4);
      *pbVar2 = *pbVar2 | 0x80;
    }
    if ((uVar8 & 8) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 4);
      *pbVar2 = *pbVar2 | 4;
    }
    if ((uVar8 >> 9 & 1) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 3);
      *pbVar2 = *pbVar2 | 0x20;
    }
    if ((uVar8 >> 0xd & 1) != 0) {
      *(byte *)pCVar1->_bits = (byte)pCVar1->_bits[0] | 0x80;
    }
    if ((uVar8 >> 0x13 & 1) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 3);
      *pbVar2 = *pbVar2 | 0x80;
    }
    if ((uVar8 >> 0x14 & 1) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 4);
      *pbVar2 = *pbVar2 | 1;
    }
    if ((uVar8 >> 0x16 & 1) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 4);
      *pbVar2 = *pbVar2 | 8;
    }
    if ((uVar8 >> 0x17 & 1) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 4);
      *pbVar2 = *pbVar2 | 0x10;
    }
    if ((uVar8 >> 0x19 & 1) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 4);
      *pbVar2 = *pbVar2 | 0x40;
    }
    if ((uVar8 >> 0x1a & 1) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 5);
      *pbVar2 = *pbVar2 | 0x20;
    }
    if ((uVar8 >> 0x1b & 1) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 6);
      *pbVar2 = *pbVar2 | 2;
    }
    if ((uVar8 >> 0x1e & 1) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 5);
      *pbVar2 = *pbVar2 | 1;
    }
    if ((uVar7 & 0x10) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 1);
      *pbVar2 = *pbVar2 | 2;
    }
    if ((uVar7 & 0x20) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 1);
      *pbVar2 = *pbVar2 | 1;
    }
    if ((uVar7 >> 8 & 1) != 0) {
      *(byte *)pCVar1->_bits = (byte)pCVar1->_bits[0] | 0x40;
    }
    if ((short)uVar7 < 0) {
      *(byte *)pCVar1->_bits = (byte)pCVar1->_bits[0] | 0x20;
    }
    if ((uVar7 >> 0x13 & 1) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 1);
      *pbVar2 = *pbVar2 | 8;
    }
    if ((uVar7 >> 0x17 & 1) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 2);
      *pbVar2 = *pbVar2 | 0x20;
    }
    if ((uVar7 >> 0x18 & 1) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 2);
      *pbVar2 = *pbVar2 | 8;
    }
    if ((uVar7 >> 0x19 & 1) != 0) {
      pCVar1->_bits[0] = pCVar1->_bits[0] | 0x4400000;
    }
    if ((uVar7 >> 0x1a & 1) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 3);
      *pbVar2 = *pbVar2 | 0xc;
    }
    if ((uVar7 >> 0x1c & 1) != 0) {
      *(byte *)pCVar1->_bits = (byte)pCVar1->_bits[0] | 8;
    }
    uVar15 = 0;
    if ((~uVar8 & 0xc000000) == 0) {
      uVar15 = in_XCR0;
    }
    if (((~uVar15 & 6) == 0 & (byte)(uVar8 >> 0x1c)) == 1) {
      uVar12 = 0x24000000000000;
      if ((uVar8 >> 0xc & 1) == 0) {
        uVar12 = 0x4000000000000;
      }
      uVar12 = uVar12 | pCVar1->_bits[0];
      pCVar1->_bits[0] = uVar12;
      if ((uVar8 >> 0x1d & 1) != 0) {
        pCVar1->_bits[0] = uVar12 | 0x10000000000000;
      }
    }
  }
  if (uVar19 < 7) {
    uVar18 = 0;
  }
  else {
    lVar20 = cpuid_Extended_Feature_Enumeration_info(7);
    uVar7 = *(uint *)(lVar20 + 4);
    uVar8 = *(uint *)(lVar20 + 8);
    uVar14 = *(uint *)(lVar20 + 0xc);
    if ((uVar7 & 1) != 0) {
      pBVar3 = (this->_features)._bits + 1;
      *(byte *)pBVar3 = (byte)*pBVar3 | 2;
    }
    if ((uVar7 & 8) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 7);
      *pbVar2 = *pbVar2 | 1;
    }
    if ((uVar7 & 0x10) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 7);
      *pbVar2 = *pbVar2 | 0x20;
    }
    if ((char)uVar7 < '\0') {
      pbVar2 = (byte *)((long)(this->_features)._bits + 5);
      *pbVar2 = *pbVar2 | 8;
    }
    if ((uVar7 >> 8 & 1) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 7);
      *pbVar2 = *pbVar2 | 2;
    }
    if ((uVar7 >> 9 & 1) != 0) {
      pBVar3 = (this->_features)._bits + 1;
      *(byte *)pBVar3 = (byte)*pBVar3 | 1;
    }
    if ((uVar7 >> 0xb & 1) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 7);
      *pbVar2 = *pbVar2 | 0x40;
    }
    if ((uVar7 >> 0x12 & 1) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 5);
      *pbVar2 = *pbVar2 | 2;
    }
    if ((uVar7 >> 0x13 & 1) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 7);
      *pbVar2 = *pbVar2 | 4;
    }
    if ((uVar7 >> 0x14 & 1) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 5);
      *pbVar2 = *pbVar2 | 4;
    }
    if ((uVar7 >> 0x16 & 1) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 1);
      *pbVar2 = *pbVar2 | 0x80;
    }
    if ((uVar7 >> 0x17 & 1) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 1);
      *pbVar2 = *pbVar2 | 0x10;
    }
    if ((uVar7 >> 0x18 & 1) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 1);
      *pbVar2 = *pbVar2 | 0x20;
    }
    if ((uVar7 >> 0x1d & 1) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 5);
      *pbVar2 = *pbVar2 | 0x10;
    }
    if ((uVar14 & 1) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 2);
      *pbVar2 = *pbVar2 | 2;
    }
    if ((uVar7 & 0x810) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 7);
      *pbVar2 = *pbVar2 | 0x80;
    }
    uVar18 = uVar7 >> 0xe;
    if ((uVar7 & 0x20) != 0 && (pCVar1->_bits[0] & 0x4000000000000) != 0) {
      pCVar1->_bits[0] = pCVar1->_bits[0] | 0x8000000000000;
    }
    if (((uVar7 >> 0x10 & 1) != 0) && ((uVar15 & 0xe6) == 0xe6)) {
      (this->_features)._bits[1] =
           (ulong)(uVar7 >> 0xc & 0x200) | (ulong)(uVar7 >> 0xb & 0x40) | (this->_features)._bits[1]
           | 4;
      if ((uVar7 >> 0x1a & 1) != 0) {
        pBVar3 = (this->_features)._bits + 1;
        *(byte *)pBVar3 = (byte)*pBVar3 | 0x10;
      }
      if ((uVar7 >> 0x1b & 1) != 0) {
        pBVar3 = (this->_features)._bits + 1;
        *(byte *)pBVar3 = (byte)*pBVar3 | 0x20;
      }
      if ((uVar7 >> 0x1c & 1) != 0) {
        pBVar3 = (this->_features)._bits + 1;
        *(byte *)pBVar3 = (byte)*pBVar3 | 8;
      }
      if ((uVar7 >> 0x1e & 1) != 0) {
        pBVar3 = (this->_features)._bits + 1;
        *(byte *)pBVar3 = (byte)*pBVar3 | 0x80;
      }
      if ((int)uVar7 < 0) {
        pbVar2 = (byte *)((long)(this->_features)._bits + 9);
        *pbVar2 = *pbVar2 | 1;
      }
      if ((uVar14 & 2) != 0) {
        pbVar2 = (byte *)((long)(this->_features)._bits + 9);
        *pbVar2 = *pbVar2 | 4;
      }
      if ((uVar14 >> 0xe & 1) != 0) {
        pbVar2 = (byte *)((long)(this->_features)._bits + 9);
        *pbVar2 = *pbVar2 | 8;
      }
      if ((uVar8 & 4) != 0) {
        pbVar2 = (byte *)((long)(this->_features)._bits + 9);
        *pbVar2 = *pbVar2 | 0x10;
      }
      if ((uVar8 & 8) != 0) {
        pbVar2 = (byte *)((long)(this->_features)._bits + 9);
        *pbVar2 = *pbVar2 | 0x20;
      }
    }
  }
  if (0xc < uVar19) {
    puVar6 = (uint *)cpuid_Processor_Extended_States_info(0xd);
    if (((~(uVar15 & *puVar6) & 0x18) == 0) && ((uVar18 & 1) != 0)) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 7);
      *pbVar2 = *pbVar2 | 0x10;
    }
    puVar6 = (uint *)cpuid_Processor_Extended_States_info(0xd);
    uVar19 = *puVar6;
    if ((uVar19 & 1) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 6);
      *pbVar2 = *pbVar2 | 1;
    }
    if ((uVar19 & 2) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 5);
      *pbVar2 = *pbVar2 | 0x40;
    }
    if ((uVar19 & 8) != 0) {
      pbVar2 = (byte *)((long)(this->_features)._bits + 5);
      *pbVar2 = *pbVar2 | 0x80;
    }
  }
  pcVar17 = this->_brandString;
  uVar15 = 0x80000000;
  uVar19 = 0x80000000;
  pcVar21 = pcVar17;
  do {
    if (uVar15 == 0) {
      puVar6 = (uint *)cpuid_basic_info(0);
    }
    else if (uVar15 == 1) {
      puVar6 = (uint *)cpuid_Version_info(1);
    }
    else if (uVar15 == 2) {
      puVar6 = (uint *)cpuid_cache_tlb_info(2);
    }
    else if (uVar15 == 3) {
      puVar6 = (uint *)cpuid_serial_info(3);
    }
    else if (uVar15 == 4) {
      puVar6 = (uint *)cpuid_Deterministic_Cache_Parameters_info(4);
    }
    else if (uVar15 == 5) {
      puVar6 = (uint *)cpuid_MONITOR_MWAIT_Features_info(5);
    }
    else if (uVar15 == 6) {
      puVar6 = (uint *)cpuid_Thermal_Power_Management_info(6);
    }
    else if (uVar15 == 7) {
      puVar6 = (uint *)cpuid_Extended_Feature_Enumeration_info(7);
    }
    else if (uVar15 == 9) {
      puVar6 = (uint *)cpuid_Direct_Cache_Access_info(9);
    }
    else if (uVar15 == 10) {
      puVar6 = (uint *)cpuid_Architectural_Performance_Monitoring_info(10);
    }
    else if (uVar15 == 0xb) {
      puVar6 = (uint *)cpuid_Extended_Topology_info(0xb);
    }
    else if (uVar15 == 0xd) {
      puVar6 = (uint *)cpuid_Processor_Extended_States_info(0xd);
    }
    else if (uVar15 == 0xf) {
      puVar6 = (uint *)cpuid_Quality_of_Service_info(0xf);
    }
    else if (uVar15 == 0x80000002) {
      puVar6 = (uint *)cpuid_brand_part1_info(0x80000002);
    }
    else if (uVar15 == 0x80000003) {
      puVar6 = (uint *)cpuid_brand_part2_info(0x80000003);
    }
    else if (uVar15 == 0x80000004) {
      puVar6 = (uint *)cpuid_brand_part3_info(0x80000004);
    }
    else {
      puVar6 = (uint *)cpuid(uVar15);
    }
    uVar18 = *puVar6;
    uVar7 = puVar6[1];
    uVar8 = puVar6[2];
    uVar14 = puVar6[3];
    switch(uVar15) {
    case 0x80000000:
      uVar19 = uVar18;
      if (0x80000007 < uVar18) {
        uVar19 = 0x80000008;
      }
      uVar15 = 0x80000000;
      break;
    case 0x80000001:
      if ((uVar14 & 1) != 0) {
        pbVar2 = (byte *)((long)(this->_features)._bits + 2);
        *pbVar2 = *pbVar2 | 4;
      }
      if ((uVar14 & 0x20) != 0) {
        pbVar2 = (byte *)((long)(this->_features)._bits + 4);
        *pbVar2 = *pbVar2 | 0x20;
      }
      if ((uVar14 & 0x40) != 0) {
        pbVar2 = (byte *)((long)(this->_features)._bits + 3);
        *pbVar2 = *pbVar2 | 0x40;
      }
      if ((char)uVar14 < '\0') {
        pbVar2 = (byte *)((long)(this->_features)._bits + 4);
        *pbVar2 = *pbVar2 | 2;
      }
      if ((uVar14 >> 8 & 1) != 0) {
        pbVar2 = (byte *)((long)(this->_features)._bits + 2);
        *pbVar2 = *pbVar2 | 1;
      }
      if ((uVar14 >> 0x15 & 1) != 0) {
        pbVar2 = (byte *)((long)(this->_features)._bits + 7);
        *pbVar2 = *pbVar2 | 8;
      }
      if ((uVar8 >> 0x14 & 1) != 0) {
        *(byte *)pCVar1->_bits = (byte)pCVar1->_bits[0] | 4;
      }
      if ((uVar8 >> 0x15 & 1) != 0) {
        pbVar2 = (byte *)((long)(this->_features)._bits + 2);
        *pbVar2 = *pbVar2 | 0x10;
      }
      if ((uVar8 >> 0x16 & 1) != 0) {
        pbVar2 = (byte *)((long)(this->_features)._bits + 2);
        *pbVar2 = *pbVar2 | 0x40;
      }
      if ((uVar8 >> 0x1b & 1) != 0) {
        pbVar2 = (byte *)((long)(this->_features)._bits + 1);
        *pbVar2 = *pbVar2 | 4;
      }
      if ((uVar8 >> 0x1e & 1) != 0) {
        pCVar1->_bits[0] = pCVar1->_bits[0] | 0x1400000;
      }
      if ((int)uVar8 < 0) {
        pbVar2 = (byte *)((long)(this->_features)._bits + 2);
        *pbVar2 = *pbVar2 | 0x80;
      }
      if ((pCVar1->_bits[0] & 0x4000000000000) != 0) {
        if ((uVar14 >> 0xb & 1) != 0) {
          pCVar1->_bits[0] = pCVar1->_bits[0] | 0x80000000000000;
        }
        if ((uVar14 >> 0x10 & 1) != 0) {
          pbVar2 = (byte *)((long)(this->_features)._bits + 6);
          *pbVar2 = *pbVar2 | 0x40;
        }
      }
      uVar15 = 0x80000001;
      if ((this->_vendorId == 2) && ((uVar14 & 0x10) != 0)) {
        *(byte *)pCVar1->_bits = (byte)pCVar1->_bits[0] | 0x10;
      }
      break;
    case 0x80000002:
    case 0x80000003:
    case 0x80000004:
      *(uint *)pcVar21 = uVar18;
      *(uint *)(pcVar21 + 4) = uVar7;
      *(uint *)(pcVar21 + 8) = uVar14;
      *(uint *)(pcVar21 + 0xc) = uVar8;
      pcVar21 = pcVar21 + 0x10;
      if (uVar15 == 0x80000004) {
        uVar15 = 0x80000007;
      }
      break;
    case 0x80000008:
      uVar15 = 0x80000008;
      if ((uVar7 & 1) != 0) {
        pbVar2 = (byte *)((long)(this->_features)._bits + 1);
        *pbVar2 = *pbVar2 | 0x40;
      }
    }
    uVar15 = uVar15 + 1;
  } while (uVar15 <= uVar19);
  cVar5 = this->_brandString[0];
  this->_brandString[0] = '\0';
  pcVar21 = this->_brandString;
  cVar13 = '\0';
  do {
    pcVar21 = pcVar21 + 1;
    if (cVar5 == ' ') {
      if (((cVar13 != '@') && (*pcVar21 != ' ')) && (*pcVar21 != '@')) goto LAB_00165763;
    }
    else {
      if (cVar5 == '\0') {
        *pcVar17 = '\0';
        lVar20 = sysconf(0x54);
        uVar11 = 1;
        if (1 < lVar20) {
          uVar11 = (uint32_t)lVar20;
        }
        this->_hwThreadsCount = uVar11;
        return;
      }
LAB_00165763:
      *pcVar17 = cVar5;
      pcVar17 = pcVar17 + 1;
      cVar13 = cVar5;
    }
    cVar5 = *pcVar21;
    *pcVar21 = '\0';
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SIZE void CpuInfo::detect() noexcept {
  reset();

#if ASMJIT_ARCH_ARM32 || ASMJIT_ARCH_ARM64
  armDetectCpuInfo(this);
#endif // ASMJIT_ARCH_ARM32 || ASMJIT_ARCH_ARM64

#if ASMJIT_ARCH_X86 || ASMJIT_ARCH_X64
  x86DetectCpuInfo(this);
#endif // ASMJIT_ARCH_X86 || ASMJIT_ARCH_X64

  _hwThreadsCount = cpuDetectHWThreadsCount();
}